

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleMessage
          (RunContext *this,AssertionInfo *info,OfType resultType,StringRef *message,
          AssertionReaction *reaction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SourceLineInfo *pSVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  size_type sVar13;
  size_t sVar14;
  size_type sVar15;
  int iVar16;
  bool bVar17;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_118;
  AssertionResult local_c0;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0xd])();
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  uVar5 = *(undefined4 *)&(info->macroName).m_start;
  uVar6 = *(undefined4 *)((long)&(info->macroName).m_start + 4);
  sVar13 = (info->macroName).m_size;
  uVar7 = *(undefined4 *)((long)&(info->macroName).m_size + 4);
  uVar8 = *(undefined4 *)&(info->lineInfo).file;
  uVar9 = *(undefined4 *)((long)&(info->lineInfo).file + 4);
  sVar14 = (info->lineInfo).line;
  uVar10 = *(undefined4 *)((long)&(info->lineInfo).line + 4);
  uVar11 = *(undefined4 *)((long)&(info->capturedExpression).m_start + 4);
  sVar15 = (info->capturedExpression).m_size;
  uVar12 = *(undefined4 *)((long)&(info->capturedExpression).m_size + 4);
  *(undefined4 *)&(this->m_lastAssertionInfo).capturedExpression.m_start =
       *(undefined4 *)&(info->capturedExpression).m_start;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).capturedExpression.m_start + 4) = uVar11;
  *(int *)&(this->m_lastAssertionInfo).capturedExpression.m_size = (int)sVar15;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).capturedExpression.m_size + 4) = uVar12;
  *(undefined4 *)&(this->m_lastAssertionInfo).lineInfo.file = uVar8;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.file + 4) = uVar9;
  *(int *)&(this->m_lastAssertionInfo).lineInfo.line = (int)sVar14;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.line + 4) = uVar10;
  *(undefined4 *)&(this->m_lastAssertionInfo).macroName.m_start = uVar5;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).macroName.m_start + 4) = uVar6;
  *(int *)&(this->m_lastAssertionInfo).macroName.m_size = (int)sVar13;
  *(undefined4 *)((long)&(this->m_lastAssertionInfo).macroName.m_size + 4) = uVar7;
  paVar1 = &local_118.message.field_2;
  local_118.message._M_string_length = 0;
  local_118.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_118.reconstructedExpression.field_2;
  local_118.reconstructedExpression._M_string_length = 0;
  local_118.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_118.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_118.lazyExpression.m_isNegated = false;
  pSVar3 = &local_c0.m_info.lineInfo;
  local_118.message._M_dataplus._M_p = (pointer)paVar1;
  local_118.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  local_118.resultType = resultType;
  local_c0.m_info.macroName.m_start = (char *)pSVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,message->m_start,message->m_start + message->m_size);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c0);
  if ((SourceLineInfo *)local_c0.m_info.macroName.m_start != pSVar3) {
    operator_delete(local_c0.m_info.macroName.m_start,(ulong)(local_c0.m_info.lineInfo.file + 1));
  }
  AssertionResult::AssertionResult(&local_c0,&this->m_lastAssertionInfo,&local_118);
  assertionEnded(this,&local_c0);
  if ((((undefined1)local_c0.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_c0.m_info.resultDisposition & SuppressFail) == 0)) {
    iVar16 = (*(((this->m_config).
                 super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_NonCopyable)._vptr_NonCopyable[6])();
    reaction->shouldDebugBreak = SUB41(iVar16,0);
    uVar4 = (this->m_totals).assertions.failed;
    iVar16 = (*(((this->m_config).
                 super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_NonCopyable)._vptr_NonCopyable[9])();
    bVar17 = true;
    if (uVar4 < (ulong)(long)iVar16) {
      bVar17 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_c0.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_c0.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_c0.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_resultData.message._M_dataplus._M_p != &local_c0.m_resultData.message.field_2) {
    operator_delete(local_c0.m_resultData.message._M_dataplus._M_p,
                    local_c0.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.reconstructedExpression._M_dataplus._M_p,
                    CONCAT71(local_118.reconstructedExpression.field_2._M_allocated_capacity._1_7_,
                             local_118.reconstructedExpression.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.message._M_dataplus._M_p,
                    CONCAT71(local_118.message.field_2._M_allocated_capacity._1_7_,
                             local_118.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RunContext::handleMessage(
            AssertionInfo const& info,
            ResultWas::OfType resultType,
            StringRef const& message,
            AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        data.message = static_cast<std::string>(message);
        AssertionResult assertionResult{ m_lastAssertionInfo, data };
        assertionEnded( assertionResult );
        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }